

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  ostream *poVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  MatrixXd *this_00;
  double dVar6;
  MatrixXd local_370;
  Tools local_358;
  Tools tools;
  Scalar local_348;
  double local_340;
  Scalar local_338;
  Scalar local_330;
  double local_328;
  Scalar local_320;
  double local_318;
  double local_310;
  Scalar local_308;
  double local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  double local_2e8;
  Scalar local_2e0;
  double local_2d8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_2d0;
  float local_2b0;
  float local_2ac;
  float dt_4;
  float dt_3;
  float dt_2;
  float dt;
  Scalar local_298;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_290;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_250;
  double local_230;
  double ro_dot;
  double phi;
  double ro;
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  Scalar local_1e8;
  Scalar local_1e0;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_198;
  Scalar local_178;
  Scalar local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_f8;
  int local_d8 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_d0;
  int local_b8 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_b0;
  int local_98 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_90;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  MeasurementPackage *local_18;
  MeasurementPackage *measurement_pack_local;
  FusionEKF *this_local;
  
  local_18 = measurement_pack;
  measurement_pack_local = (MeasurementPackage *)this;
  if ((this->is_initialized_ & 1U) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"EKF: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_28,4);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->ekf_).x_,&local_28);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_28);
    local_60 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
               &local_60);
    local_68 = 1.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_58,&local_68);
    local_70 = 1.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar2,&local_70);
    local_78 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_78);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_58);
    local_98[1] = 4;
    local_98[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_90,local_98 + 1,local_98);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).P_,&local_90);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_90);
    local_b8[1] = 4;
    local_b8[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,local_b8 + 1,local_b8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).F_,&local_b0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_b0);
    local_d8[1] = 4;
    local_d8[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,local_d8 + 1,local_d8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).Q_,&local_d0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d0);
    local_100 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_f8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).F_,
               &local_100);
    local_108 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_f8,&local_108);
    local_110 = 1.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_110);
    local_118 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_118);
    local_120 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_120);
    local_128 = 1.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_128);
    local_130 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_130);
    local_138 = 1.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_138);
    local_140 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_140);
    local_148 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_148);
    local_150 = 1.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_150);
    local_158 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_158);
    local_160 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_160);
    local_168 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_168);
    local_170 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_170);
    local_178 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar3,&local_178)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_f8)
    ;
    local_1a0 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_198,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).P_,
               &local_1a0);
    local_1a8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_198,&local_1a8);
    local_1b0 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1b0);
    local_1b8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1b8);
    local_1c0 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1c0);
    local_1c8 = 1.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1c8);
    local_1d0 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1d0);
    local_1d8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1d8);
    local_1e0 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1e0);
    local_1e8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1e8);
    local_1f0 = 1000.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1f0);
    local_1f8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_1f8);
    local_200 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_200);
    local_208 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_208);
    local_210 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_210);
    ro = 1000.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar3,&ro);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_198);
    if (local_18->sensor_type_ == RADAR) {
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      phi = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      ro_dot = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,2);
      dVar6 = phi;
      local_230 = *pdVar4;
      local_258 = cos(ro_dot);
      local_258 = dVar6 * local_258;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_250,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
                 &local_258);
      dVar6 = phi;
      local_260 = sin(ro_dot);
      local_260 = dVar6 * local_260;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_250,&local_260);
      dVar6 = local_230;
      local_268 = cos(ro_dot);
      local_268 = dVar6 * local_268;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar2,&local_268);
      dVar6 = local_230;
      local_270 = sin(ro_dot);
      local_270 = dVar6 * local_270;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_270)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_250);
    }
    else if (local_18->sensor_type_ == LASER) {
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_290,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
                 pdVar4);
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_290,pdVar4);
      local_298 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar2,&local_298);
      _dt_2 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar2,(Scalar *)&dt_2);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_290);
    }
    this->previous_timestamp_ = local_18->timestamp_;
    this->is_initialized_ = true;
  }
  else {
    dt_3 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) / 1000000.0);
    this->previous_timestamp_ = measurement_pack->timestamp_;
    dt_4 = dt_3 * dt_3;
    local_2ac = dt_4 * dt_3;
    local_2b0 = local_2ac * dt_3;
    dVar6 = (double)dt_3;
    this_00 = &(this->ekf_).F_;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,0,2)
    ;
    *pSVar5 = dVar6;
    dVar6 = (double)dt_3;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,1,3)
    ;
    *pSVar5 = dVar6;
    local_2d8 = (double)(local_2b0 * 0.25 * this->noise_ax);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_2d0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).Q_,
               &local_2d8);
    local_2e0 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_2d0,&local_2e0);
    local_2e8 = (double)(local_2ac * 0.5 * this->noise_ax);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_2e8);
    local_2f0 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_2f0);
    local_2f8 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_2f8);
    local_300 = (double)(local_2b0 * 0.25 * this->noise_ay);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_300);
    local_308 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_308);
    local_310 = (double)(local_2ac * 0.5 * this->noise_ay);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_310);
    local_318 = (double)(local_2ac * 0.5 * this->noise_ax);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_318);
    local_320 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_320);
    local_328 = (double)(dt_4 * this->noise_ax);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_328);
    local_330 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_330);
    local_338 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_338);
    local_340 = (double)(local_2ac * 0.5 * this->noise_ay);
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_340);
    local_348 = 0.0;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar3,&local_348);
    tools._vptr_Tools = (_func_int **)(double)(dt_4 * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar3,(Scalar *)&tools);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_2d0);
    KalmanFilter::Predict(&this->ekf_);
    if (local_18->sensor_type_ == RADAR) {
      Tools::Tools(&local_358);
      Tools::CalculateJacobian(&local_370,&local_358,&(this->ekf_).x_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&local_370);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_370);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_radar_);
      KalmanFilter::UpdateEKF(&this->ekf_,&local_18->raw_measurements_);
      Tools::~Tools(&local_358);
    }
    else {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->H_laser_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_laser_);
      KalmanFilter::Update(&this->ekf_,&local_18->raw_measurements_);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &(this->ekf_).x_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &(this->ekf_).P_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {

  /*****************************************************************************
   *  Initialization
   ****************************************************************************/

  if (!is_initialized_) {

    // Initialize the state ekf_.x_
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // prediction covariance matrix
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.F_ = MatrixXd(4, 4);
    ekf_.Q_ = MatrixXd(4, 4);

    // initialize transition matrix
    ekf_.F_ << 1, 0, 1, 0,
              0, 1, 0, 1,
              0, 0, 1, 0,
              0, 0, 0, 1;

    // initialize prediction covariance matrix
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;
    
    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      
      // convert radar measurements from polar to cartesian
      // Set state ekf_.x_ to the first measurement.
      double ro = measurement_pack.raw_measurements_[0];
      double phi = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      ekf_.x_ << ro * cos(phi), ro * sin(phi), ro_dot * cos(phi), ro_dot * sin(phi);
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      // Set state ekf_.x_ to the first measurement.
      ekf_.x_ << measurement_pack.raw_measurements_(0), measurement_pack.raw_measurements_(1), 0.0, 0.0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;	//dt - expressed in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // update F matrix
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  // Update the process covariance matrix Q
  // noise_ax = 9 and noise_ay = 9
  ekf_.Q_ << dt_4 / 4 * noise_ax, 0, dt_3 / 2 * noise_ax, 0,
    0, dt_4 / 4 * noise_ay, 0, dt_3 / 2 * noise_ay,
    dt_3 / 2 * noise_ax, 0, dt_2*noise_ax, 0,
    0, dt_3 / 2 * noise_ay, 0, dt_2*noise_ay;
  
  // predict
  
  //if (fabs(dt) > 0.001) {
  //  ekf_.Predict();
  //}
  ekf_.Predict();
  

  /*****************************************************************************
   *  Update: the state and covariance matrices.
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Radar updates
    Tools tools;
    ekf_.H_ = tools.CalculateJacobian(ekf_.x_);
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    
  } else {

    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}